

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::computeMinActivity
          (HighsDomain *this,HighsInt start,HighsInt end,HighsInt *ARindex,double *ARvalue,
          HighsInt *ninfmin,HighsCDouble *activitymin)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer ppVar7;
  int *piVar8;
  long lVar9;
  HighsInt HVar10;
  pointer ppVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  bVar12 = this->infeasible_;
  activitymin->hi = 0.0;
  activitymin->lo = 0.0;
  *ninfmin = 0;
  if (bVar12 == true) {
    if (end != start) {
      HVar10 = *ninfmin;
      dVar13 = activitymin->lo;
      pdVar3 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = (long)start;
      dVar14 = activitymin->hi;
      do {
        iVar1 = ARindex[lVar9];
        ppVar11 = (pointer)(pdVar3 + iVar1);
        piVar8 = piVar4 + iVar1;
        ppVar7 = (this->prevboundval_).
                 super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        while( true ) {
          iVar2 = *piVar8;
          if ((iVar2 < this->infeasible_pos) &&
             (((dVar15 = ppVar11->first, iVar2 == -1 || (ppVar7[iVar2].first != dVar15)) ||
              (NAN(ppVar7[iVar2].first) || NAN(dVar15))))) break;
          ppVar11 = ppVar7 + iVar2;
          piVar8 = &ppVar7[iVar2].second;
        }
        ppVar11 = (pointer)(pdVar6 + iVar1);
        piVar8 = piVar5 + iVar1;
        while( true ) {
          iVar1 = *piVar8;
          if ((iVar1 < this->infeasible_pos) &&
             (((dVar16 = ppVar11->first, iVar1 == -1 || (ppVar7[iVar1].first != dVar16)) ||
              (NAN(ppVar7[iVar1].first) || NAN(dVar16))))) break;
          ppVar11 = ppVar7 + iVar1;
          piVar8 = &ppVar7[iVar1].second;
        }
        if (0.0 <= ARvalue[lVar9]) {
          dVar17 = -INFINITY;
          dVar16 = dVar15;
          if (-INFINITY < dVar15) goto LAB_002964a2;
        }
        else {
          dVar17 = -INFINITY;
          if (dVar16 < INFINITY) {
LAB_002964a2:
            dVar17 = ARvalue[lVar9] * dVar16;
          }
        }
        if (-INFINITY < dVar17) {
          dVar15 = dVar17 + dVar14;
          activitymin->hi = dVar15;
          dVar13 = dVar13 + (dVar14 - (dVar15 - dVar17)) + (dVar17 - (dVar15 - (dVar15 - dVar17)));
          activitymin->lo = dVar13;
        }
        else {
          HVar10 = HVar10 + 1;
          *ninfmin = HVar10;
          dVar15 = dVar14;
        }
        lVar9 = lVar9 + 1;
        dVar14 = dVar15;
      } while ((int)lVar9 != end);
    }
  }
  else if (end != start) {
    HVar10 = *ninfmin;
    dVar13 = activitymin->lo;
    pdVar3 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    dVar14 = activitymin->hi;
    do {
      if (0.0 <= ARvalue[start + lVar9]) {
        dVar15 = pdVar3[ARindex[start + lVar9]];
        bVar12 = -INFINITY < dVar15;
      }
      else {
        dVar15 = pdVar6[ARindex[start + lVar9]];
        bVar12 = dVar15 < INFINITY;
      }
      dVar16 = -INFINITY;
      if (bVar12) {
        dVar16 = ARvalue[start + lVar9] * dVar15;
      }
      if (-INFINITY < dVar16) {
        dVar15 = dVar16 + dVar14;
        activitymin->hi = dVar15;
        dVar13 = dVar13 + (dVar14 - (dVar15 - dVar16)) + (dVar16 - (dVar15 - (dVar15 - dVar16)));
        activitymin->lo = dVar13;
      }
      else {
        HVar10 = HVar10 + 1;
        *ninfmin = HVar10;
        dVar15 = dVar14;
      }
      lVar9 = lVar9 + 1;
      dVar14 = dVar15;
    } while (end - start != (int)lVar9);
  }
  dVar13 = activitymin->hi;
  dVar14 = dVar13 + activitymin->lo;
  activitymin->hi = dVar14;
  activitymin->lo = (activitymin->lo - (dVar14 - dVar13)) + (dVar13 - (dVar14 - (dVar14 - dVar13)));
  return;
}

Assistant:

void HighsDomain::computeMinActivity(HighsInt start, HighsInt end,
                                     const HighsInt* ARindex,
                                     const double* ARvalue, HighsInt& ninfmin,
                                     HighsCDouble& activitymin) {
  if (infeasible_) {
    activitymin = 0.0;
    ninfmin = 0;
    for (HighsInt j = start; j != end; ++j) {
      HighsInt col = ARindex[j];
      double val = ARvalue[j];

      assert(col < int(col_lower_.size()));

      HighsInt tmp;
      double lb = getColLowerPos(col, infeasible_pos - 1, tmp);
      double ub = getColUpperPos(col, infeasible_pos - 1, tmp);
      double contributionmin = activityContributionMin(val, lb, ub);

      if (contributionmin == -kHighsInf)
        ++ninfmin;
      else
        activitymin += contributionmin;
    }

  } else {
    activitymin = 0.0;
    ninfmin = 0;
    for (HighsInt j = start; j != end; ++j) {
      HighsInt col = ARindex[j];
      double val = ARvalue[j];

      assert(col < int(col_lower_.size()));

      double contributionmin =
          activityContributionMin(val, col_lower_[col], col_upper_[col]);

      if (contributionmin == -kHighsInf)
        ++ninfmin;
      else
        activitymin += contributionmin;
    }
  }
  activitymin.renormalize();
}